

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysy_bridge.cpp
# Opt level: O0

shared_ptr<ast_compunit> read_source_ast(char *fname)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  char *in_RSI;
  shared_ptr<ast_compunit> sVar3;
  int status;
  char *fname_local;
  shared_ptr<ast_compunit> *ret;
  
  yyin = (FILE *)fopen(in_RSI,"r");
  if ((FILE *)yyin != (FILE *)0x0) {
    std::shared_ptr<ast_compunit>::shared_ptr((shared_ptr<ast_compunit> *)fname);
    iVar1 = yyparse((shared_ptr<ast_compunit> *)fname);
    fclose((FILE *)yyin);
    _Var2._M_pi = extraout_RDX;
    if (iVar1 != 0) {
      perror("Syntax error returned from yyparse().");
      _Var2._M_pi = extraout_RDX_00;
    }
    sVar3.super___shared_ptr<ast_compunit,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var2._M_pi;
    sVar3.super___shared_ptr<ast_compunit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)fname;
    return (shared_ptr<ast_compunit>)
           sVar3.super___shared_ptr<ast_compunit,_(__gnu_cxx::_Lock_policy)2>;
  }
  perror("Error opening source file");
  exit(1);
}

Assistant:

std::shared_ptr<ast_compunit> read_source_ast(const char *fname) {
  yyin = fopen(fname, "r");
  if(!yyin) {
    perror("Error opening source file");
    exit(1);
  }
  std::shared_ptr<ast_compunit> ret;
  int status = yyparse(ret);
  fclose(yyin);
  if(status) {
    perror("Syntax error returned from yyparse().");
  }
  return ret;
}